

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall LLVMBC::Instruction::Instruction(Instruction *this,Type *type,ValueKind kind)

{
  Value::Value(&this->super_Value,type,kind);
  this->is_terminator = false;
  (this->operands).
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->operands).
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operands).
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attachments)._M_h._M_buckets = &(this->attachments)._M_h._M_single_bucket;
  (this->attachments)._M_h._M_bucket_count = 1;
  (this->attachments)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->attachments)._M_h._M_element_count = 0;
  (this->attachments)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->attachments)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->attachments)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Instruction::Instruction(Type *type, ValueKind kind)
    : Value(type, kind)
{
}